

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt * Js::JavascriptBigInt::Add(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  bool bVar1;
  int iVar2;
  ScriptContext *scriptContext;
  JavascriptBigInt *pbi2_local;
  JavascriptBigInt *pbi1_local;
  
  bVar1 = IsZero(pbi1);
  pbi1_local = pbi2;
  if ((!bVar1) && (bVar1 = IsZero(pbi2), pbi1_local = pbi1, !bVar1)) {
    if ((pbi1->m_isNegative & 1U) == (pbi2->m_isNegative & 1U)) {
      if (pbi1->m_length < pbi2->m_length) {
        AddAbsolute(pbi2,pbi1);
        pbi1_local = pbi2;
      }
      else {
        AddAbsolute(pbi1,pbi2);
      }
    }
    else {
      iVar2 = CompareAbsolute(pbi1,pbi2);
      if (iVar2 == 0) {
        scriptContext = RecyclableObject::GetScriptContext(&pbi1->super_RecyclableObject);
        pbi1_local = CreateZero(scriptContext);
      }
      else if (iVar2 == 1) {
        SubAbsolute(pbi1,pbi2);
      }
      else {
        SubAbsolute(pbi2,pbi1);
        pbi1_local = pbi2;
      }
    }
  }
  return pbi1_local;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Add(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        if (JavascriptBigInt::IsZero(pbi1)) 
        {
            return pbi2;
        }
        if (JavascriptBigInt::IsZero(pbi2))
        {
            return pbi1;
        }

        if (pbi1->m_isNegative == pbi2->m_isNegative) // (-a)+(-b) = -(a+b)
        {
            if (pbi1->m_length >= pbi2->m_length)
            {
                JavascriptBigInt::AddAbsolute(pbi1, pbi2);
                return pbi1;
            }
            JavascriptBigInt::AddAbsolute(pbi2, pbi1);
            return pbi2;
        }
        else 
        {
            switch (pbi1->CompareAbsolute(pbi2))
            {
            case 0:
                return JavascriptBigInt::CreateZero(pbi1->GetScriptContext()); // a + (-a) = -a + a = 0
            case 1: 
                JavascriptBigInt::SubAbsolute(pbi1, pbi2); // a + (-b) = a - b or (-a) + b = -(a-b)
                return pbi1;
            default:
                JavascriptBigInt::SubAbsolute(pbi2, pbi1); // -a + b = b - a or a + (-b) = -(b-a)
                return pbi2;
            }
        }
    }